

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O2

void __thiscall
LatencyEncodingSynapse::initialize(LatencyEncodingSynapse *this,Population *n_from,Population *n_to)

{
  double *__ptr;
  Index IVar1;
  int iVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  NoEvent *this_00;
  ostream *poVar5;
  undefined8 *puVar6;
  Matrix<double,__1,_1,_0,__1,_1> local_40;
  
  iVar2 = (*n_from->_vptr_Population[1])(n_from);
  this->inputSize = iVar2;
  iVar2 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar2;
  if (this->inputSize == iVar2) {
    (this->super_Synapse).from_population = n_from;
    (this->super_Synapse).to_population = n_to;
    pCVar3 = Clock::getInstance();
    this->clock = pCVar3;
    pLVar4 = Logging::getInstance();
    this->logger = pLVar4;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_40,&this->inputSize);
    __ptr = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    IVar1 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = __ptr
    ;
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1
    ;
    free(__ptr);
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0xbff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->spikeTimes,
               (Scalar *)&local_40);
    this->currentWindow = this->param->window_length_s;
    for (iVar2 = 0; iVar2 < this->inputSize; iVar2 = iVar2 + 1) {
      this_00 = (NoEvent *)operator_new(0x18);
      NoEvent::NoEvent(this_00);
      local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this_00;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_40);
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Number of input neurons not equal to number of output neurons");
  std::endl<char,std::char_traits<char>>(poVar5);
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Number of input neurons not equal to number of output neurons";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void LatencyEncodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    spikeTimes = Eigen::VectorXd(inputSize);
    spikeTimes.setConstant(-1);
    currentWindow = param->window_length_s;
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new NoEvent());
    }
}